

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

char * __thiscall Assimp::ColladaParser::GetTextContent(ColladaParser *this)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  
  pcVar1 = TestTextContent(this);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  std::__cxx11::string::string((string *)&local_30,"Invalid contents in element \"n\".",&local_31);
  ThrowException(this,&local_30);
}

Assistant:

const char* ColladaParser::GetTextContent()
{
    const char* sz = TestTextContent();
    if (!sz) {
        ThrowException("Invalid contents in element \"n\".");
    }
    return sz;
}